

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetConfidentialTxOutIndex
              (void *handle,char *tx_hex_string,char *address,char *direct_locking_script,
              uint32_t *index)

{
  undefined1 uVar1;
  bool bVar2;
  undefined8 uVar3;
  char *in_RCX;
  CfdException *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  Address addr;
  string addr_str;
  ElementsAddressFactory address_factory;
  bool is_find;
  ConfidentialTransactionContext tx;
  string *in_stack_fffffffffffff708;
  ElementsConfidentialAddress *in_stack_fffffffffffff710;
  AddressFactory *in_stack_fffffffffffff718;
  string *in_stack_fffffffffffff720;
  string *message;
  undefined4 in_stack_fffffffffffff728;
  undefined1 in_stack_fffffffffffff72c;
  undefined1 in_stack_fffffffffffff72d;
  undefined1 in_stack_fffffffffffff72e;
  undefined1 in_stack_fffffffffffff72f;
  CfdException *in_stack_fffffffffffff730;
  undefined6 in_stack_fffffffffffff740;
  undefined1 in_stack_fffffffffffff747;
  undefined7 in_stack_fffffffffffff780;
  uint32_t *in_stack_fffffffffffff788;
  Address *in_stack_fffffffffffff790;
  undefined6 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79e;
  _Alloc_hider in_stack_fffffffffffff79f;
  Script *in_stack_fffffffffffff7a0;
  ConfidentialTransactionContext *in_stack_fffffffffffff7a8;
  uint32_t *in_stack_fffffffffffff7b8;
  ConfidentialTransactionContext *in_stack_fffffffffffff7c0;
  Address local_828;
  ElementsConfidentialAddress local_6b0;
  Address local_500;
  Address local_388;
  allocator local_209;
  string local_208 [2];
  allocator local_1b9;
  string local_1b8;
  Script local_198;
  byte local_15a;
  allocator local_159;
  string local_158 [222];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58 [2];
  char *local_28;
  CfdException *local_20;
  char *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  uVar1 = cfd::capi::IsEmptyString(local_18);
  if ((bool)uVar1) {
    local_58[0].filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_58[0].filename = local_58[0].filename + 1;
    local_58[0].line = 0x38a;
    local_58[0].funcname = "CfdGetConfidentialTxOutIndex";
    cfd::core::logger::warn<>(local_58,"tx is null or empty.");
    local_7a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Failed to parameter. tx is null or empty.",&local_79);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffff730,
               CONCAT13(in_stack_fffffffffffff72f,
                        CONCAT12(in_stack_fffffffffffff72e,
                                 CONCAT11(in_stack_fffffffffffff72d,in_stack_fffffffffffff72c))),
               in_stack_fffffffffffff720);
    local_7a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,local_18,&local_159);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  local_15a = 0;
  bVar2 = cfd::capi::IsEmptyString(local_28);
  if (bVar2) {
    bVar2 = cfd::capi::IsEmptyString((char *)local_20);
    if (bVar2) {
      in_stack_fffffffffffff72d =
           cfd::ConfidentialTransactionContext::IsFindFeeTxOut
                     (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
      local_15a = in_stack_fffffffffffff72d;
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory
                ((ElementsAddressFactory *)
                 CONCAT17(in_stack_fffffffffffff747,CONCAT16(bVar2,in_stack_fffffffffffff740)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_208,(char *)local_20,&local_209);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      cfd::core::Address::Address(&local_388);
      in_stack_fffffffffffff72f =
           cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(local_208);
      if ((bool)in_stack_fffffffffffff72f) {
        cfd::ElementsAddressFactory::GetConfidentialAddress
                  ((ElementsAddressFactory *)
                   CONCAT17(in_stack_fffffffffffff72f,
                            CONCAT16(in_stack_fffffffffffff72e,
                                     CONCAT15(in_stack_fffffffffffff72d,
                                              CONCAT14(in_stack_fffffffffffff72c,
                                                       in_stack_fffffffffffff728)))),
                   in_stack_fffffffffffff720);
        cfd::core::ElementsConfidentialAddress::GetUnblindedAddress(&local_500,&local_6b0);
        cfd::core::Address::operator=(&local_388,&local_500);
        cfd::core::Address::~Address(&in_stack_fffffffffffff710->unblinded_address_);
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                  (in_stack_fffffffffffff710);
        in_stack_fffffffffffff730 = local_20;
      }
      else {
        cfd::AddressFactory::GetAddress
                  (in_stack_fffffffffffff718,(string *)in_stack_fffffffffffff710);
        cfd::core::Address::operator=(&local_388,&local_828);
        cfd::core::Address::~Address(&in_stack_fffffffffffff710->unblinded_address_);
        in_stack_fffffffffffff730 = local_20;
      }
      in_stack_fffffffffffff72e =
           cfd::ConfidentialTransactionContext::IsFindTxOut
                     ((ConfidentialTransactionContext *)
                      CONCAT17(in_stack_fffffffffffff79f,
                               CONCAT16(in_stack_fffffffffffff79e,in_stack_fffffffffffff798)),
                      in_stack_fffffffffffff790,in_stack_fffffffffffff788,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT17(uVar1,in_stack_fffffffffffff780));
      local_15a = in_stack_fffffffffffff72e;
      cfd::core::Address::~Address(&in_stack_fffffffffffff710->unblinded_address_);
      std::__cxx11::string::~string((string *)local_208);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x5ab08f);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,local_28,&local_1b9);
    cfd::core::Script::Script(&local_198,&local_1b8);
    local_15a = cfd::ConfidentialTransactionContext::IsFindTxOut
                          (in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                           (uint32_t *)
                           CONCAT17(in_stack_fffffffffffff79f,
                                    CONCAT16(in_stack_fffffffffffff79e,in_stack_fffffffffffff798)),
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_fffffffffffff790);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff710);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  }
  if ((local_15a & 1) != 0) {
    local_4 = 0;
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)in_stack_fffffffffffff710);
    return local_4;
  }
  strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
          ,0x2f);
  cfd::core::logger::warn<>((CfdSourceLocation *)&stack0xfffffffffffff7c0,"target not found.");
  uVar3 = __cxa_allocate_exception(0x30);
  message = (string *)&stack0xfffffffffffff79f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffff7a0,"Failed to parameter. search target is not found.",
             (allocator *)message);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffff730,
             CONCAT13(in_stack_fffffffffffff72f,
                      CONCAT12(in_stack_fffffffffffff72e,
                               CONCAT11(in_stack_fffffffffffff72d,in_stack_fffffffffffff72c))),
             message);
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxOutIndex(
    void* handle, const char* tx_hex_string, const char* address,
    const char* direct_locking_script, uint32_t* index) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionContext tx(tx_hex_string);
    bool is_find = false;

    if (!IsEmptyString(direct_locking_script)) {
      is_find = tx.IsFindTxOut(Script(direct_locking_script), index);
    } else if (!IsEmptyString(address)) {
      ElementsAddressFactory address_factory;
      std::string addr_str(address);
      Address addr;
      if (ElementsConfidentialAddress::IsConfidentialAddress(addr_str)) {
        addr = address_factory.GetConfidentialAddress(addr_str)
                   .GetUnblindedAddress();
      } else {
        addr = address_factory.GetAddress(addr_str);
      }
      is_find = tx.IsFindTxOut(addr, index);
    } else {
      // fee
      is_find = tx.IsFindFeeTxOut(index);
    }
    if (!is_find) {
      warn(CFD_LOG_SOURCE, "target not found.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. search target is not found.");
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}